

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall HighsSparseMatrix::applyScale(HighsSparseMatrix *this,HighsScale *scale)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      iVar9 = *piVar3;
      do {
        iVar2 = piVar3[lVar10 + 1];
        if (iVar9 < iVar2) {
          lVar8 = (long)iVar9;
          do {
            pdVar7[lVar8] = pdVar5[lVar10] * pdVar6[piVar4[lVar8]] * pdVar7[lVar8];
            lVar8 = lVar8 + 1;
          } while (iVar2 != lVar8);
        }
        lVar10 = lVar10 + 1;
        iVar9 = iVar2;
      } while (lVar10 != iVar1);
    }
  }
  else {
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      iVar9 = *piVar3;
      do {
        iVar2 = piVar3[lVar10 + 1];
        if (iVar9 < iVar2) {
          lVar8 = (long)iVar9;
          do {
            pdVar7[lVar8] = pdVar5[piVar4[lVar8]] * pdVar6[lVar10] * pdVar7[lVar8];
            lVar8 = lVar8 + 1;
          } while (iVar2 != lVar8);
        }
        lVar10 = lVar10 + 1;
        iVar9 = iVar2;
      } while (lVar10 != iVar1);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}